

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswSim.c
# Opt level: O0

int Ssw_SmlCheckXorImplication(Ssw_Sml_t *p,Aig_Obj_t *pObjLi,Aig_Obj_t *pObjLo,Aig_Obj_t *pCand)

{
  ulong uVar1;
  uint uVar2;
  Aig_Obj_t *pAVar3;
  uint *puVar4;
  uint *puVar5;
  uint *puVar6;
  int local_4c;
  int k;
  uint *pSimCand;
  uint *pSimLo;
  uint *pSimLi;
  Aig_Obj_t *pCand_local;
  Aig_Obj_t *pObjLo_local;
  Aig_Obj_t *pObjLi_local;
  Ssw_Sml_t *p_local;
  
  if ((*(ulong *)&pObjLo->field_0x18 >> 3 & 1) != 0) {
    __assert_fail("pObjLo->fPhase == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/ssw/sswSim.c"
                  ,0xce,
                  "int Ssw_SmlCheckXorImplication(Ssw_Sml_t *, Aig_Obj_t *, Aig_Obj_t *, Aig_Obj_t *)"
                 );
  }
  pAVar3 = Aig_Regular(pCand);
  puVar4 = Ssw_ObjSim(p,pAVar3->Id);
  puVar5 = Ssw_ObjSim(p,pObjLi->Id);
  puVar6 = Ssw_ObjSim(p,pObjLo->Id);
  pAVar3 = Aig_Regular(pCand);
  uVar1 = *(ulong *)&pAVar3->field_0x18;
  uVar2 = Aig_IsComplement(pCand);
  if (((uint)(uVar1 >> 3) & 1) == uVar2) {
    for (local_4c = p->nWordsPref; local_4c < p->nWordsTotal; local_4c = local_4c + 1) {
      if ((puVar4[local_4c] & (puVar5[local_4c] ^ puVar6[local_4c])) != 0) {
        return 0;
      }
    }
  }
  else {
    for (local_4c = p->nWordsPref; local_4c < p->nWordsTotal; local_4c = local_4c + 1) {
      if (((puVar4[local_4c] ^ 0xffffffff) & (puVar5[local_4c] ^ puVar6[local_4c])) != 0) {
        return 0;
      }
    }
  }
  return 1;
}

Assistant:

int Ssw_SmlCheckXorImplication( Ssw_Sml_t * p, Aig_Obj_t * pObjLi, Aig_Obj_t * pObjLo, Aig_Obj_t * pCand )
{
    unsigned * pSimLi, * pSimLo, * pSimCand;
    int k;
    assert( pObjLo->fPhase == 0 );
    // pObjLi->fPhase may be 1, but the LI simulation data is not complemented!
    pSimCand = Ssw_ObjSim( p, Aig_Regular(pCand)->Id );
    pSimLi   = Ssw_ObjSim( p, pObjLi->Id );
    pSimLo   = Ssw_ObjSim( p, pObjLo->Id );
    if ( Aig_Regular(pCand)->fPhase ^ Aig_IsComplement(pCand) )
    {
        for ( k = p->nWordsPref; k < p->nWordsTotal; k++ )
            if ( ~pSimCand[k] & (pSimLi[k] ^ pSimLo[k]) )
                return 0;
    }
    else
    {
        for ( k = p->nWordsPref; k < p->nWordsTotal; k++ )
            if ( pSimCand[k] & (pSimLi[k] ^ pSimLo[k]) )
                return 0;
    }
    return 1;
}